

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O2

void __thiscall
Fl_PostScript_Graphics_Driver::draw_image_mono
          (Fl_PostScript_Graphics_Driver *this,Fl_Draw_Image_Cb call,void *data,int ix,int iy,int iw
          ,int ih,int D)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  void *data_00;
  int iVar4;
  uchar *puVar5;
  Fl_PostScript_Graphics_Driver *this_00;
  char *pcVar6;
  long lVar7;
  int iVar8;
  uchar *puVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  dVar11 = (double)ix;
  dVar12 = (double)iw;
  dVar13 = (double)ih;
  fwrite("save\n",5,1,(FILE *)this->output);
  if (this->lang_level_ < 2) {
    fprintf((FILE *)this->output,"%g %g %g %g %i %i GI",dVar11,(double)iy + dVar13,dVar12,-dVar13,
            (ulong)(uint)iw,(ulong)(uint)ih);
  }
  else {
    pcVar6 = "true";
    if (this->interpolate_ == 0) {
      pcVar6 = "false";
    }
    dVar14 = (double)iy + dVar13;
    if ((this->lang_level_ == 2) || (this->mask == (uchar *)0x0)) {
      fprintf((FILE *)this->output,"%g %g %g %g %i %i %s GII\n",dVar11,dVar14,dVar12,-dVar13,
              (ulong)(uint)iw,(ulong)(uint)ih);
    }
    else {
      fprintf((FILE *)this->output,"%g %g %g %g %i %i %i %i %s GIM\n",dVar11,dVar14,dVar12,-dVar13,
              (ulong)(uint)iw,(ulong)(uint)ih,(ulong)(uint)this->mx,(ulong)(uint)this->my,pcVar6);
    }
  }
  this_00 = (Fl_PostScript_Graphics_Driver *)(long)(D * iw);
  puVar3 = (uchar *)operator_new__((ulong)this_00);
  puVar5 = this->mask;
  data_00 = prepare_rle85(this_00);
  iVar4 = 0;
  iVar1 = 0;
  if (0 < iw) {
    iVar1 = iw;
  }
  iVar2 = 0;
  if (0 < ih) {
    iVar2 = ih;
  }
  for (; iVar4 != iVar2; iVar4 = iVar4 + 1) {
    if ((this->mask != (uchar *)0x0) && (2 < this->lang_level_)) {
      for (iVar8 = 0; iVar8 < this->my / ih; iVar8 = iVar8 + 1) {
        for (lVar7 = 0; (int)lVar7 < (this->mx + 7) / 8; lVar7 = lVar7 + 1) {
          write_rle85(this,""[puVar5[lVar7] & 0xf] << 4 | ""[puVar5[lVar7] >> 4],data_00);
        }
        puVar5 = puVar5 + lVar7;
      }
    }
    (*call)(data,0,iVar4,iw,puVar3);
    puVar9 = puVar3;
    iVar8 = iVar1;
    while (bVar10 = iVar8 != 0, iVar8 = iVar8 + -1, bVar10) {
      write_rle85(this,*puVar9,data_00);
      puVar9 = puVar9 + D;
    }
  }
  close_rle85(this,data_00);
  fwrite("restore\n",8,1,(FILE *)this->output);
  operator_delete__(puVar3);
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::draw_image_mono(Fl_Draw_Image_Cb call, void *data, int ix, int iy, int iw, int ih, int D) {
  double x = ix, y = iy, w = iw, h = ih;

  fprintf(output,"save\n");
  int i,j,k;
  const char * interpol;
  if (lang_level_>1){
    if (interpolate_) interpol="true";
    else interpol="false";
    if (mask && lang_level_>2)
      fprintf(output, "%g %g %g %g %i %i %i %i %s GIM\n", x , y+h , w , -h , iw , ih, mx, my, interpol);
    else
      fprintf(output, "%g %g %g %g %i %i %s GII\n", x , y+h , w , -h , iw , ih, interpol);
  } else
    fprintf(output , "%g %g %g %g %i %i GI", x , y+h , w , -h , iw , ih);

  int LD=iw*D;
  uchar *rgbdata=new uchar[LD];
  uchar *curmask=mask;
  void *big = prepare_rle85();
  for (j=0; j<ih;j++){

    if (mask && lang_level_>2){  // InterleaveType 2 mask data
      for (k=0; k<my/ih;k++){ //for alpha pseudo-masking
        for (i=0; i<((mx+7)/8);i++){
          write_rle85(swap_byte(*curmask), big);
          curmask++;
        }
      }
    }
    call(data,0,j,iw,rgbdata);
    uchar *curdata=rgbdata;
    for (i=0 ; i<iw ; i++) {
      write_rle85(curdata[0], big);
      curdata +=D;
    }
  }
  close_rle85(big);
  fprintf(output,"restore\n");
  delete[] rgbdata;
}